

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  ImFontAtlasCustomRect *rect;
  ImFont **ppIVar1;
  long in_RDI;
  float unaff_retaddr;
  float unaff_retaddr_00;
  float in_stack_00000008;
  int i_1;
  ImVec2 uv1;
  ImVec2 uv0;
  ImFontAtlasCustomRect *r;
  int i;
  ImFontAtlas *in_stack_00000050;
  int local_2c;
  ImVec2 in_stack_ffffffffffffffd8;
  ImVec2 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  float v1;
  
  ImFontAtlasBuildRenderDefaultTexData
            ((ImFontAtlas *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  ImFontAtlasBuildRenderLinesTexData(in_stack_00000050);
  for (v1 = 0.0; (int)v1 < *(int *)(in_RDI + 0x58); v1 = (float)((int)v1 + 1)) {
    rect = ImVector<ImFontAtlasCustomRect>::operator[]
                     ((ImVector<ImFontAtlasCustomRect> *)(in_RDI + 0x58),(int)v1);
    if ((rect->Font != (ImFont *)0x0) && (rect->GlyphID != 0)) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8);
      ImFontAtlas::CalcCustomRectUV
                ((ImFontAtlas *)CONCAT44(v1,in_stack_fffffffffffffff0),rect,
                 (ImVec2 *)in_stack_ffffffffffffffe0,(ImVec2 *)in_stack_ffffffffffffffd8);
      ImFont::AddGlyph((ImFont *)r,(ImFontConfig *)uv0,uv1.y._2_2_,uv1.x,(float)i_1,
                       in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                       (float)((ulong)in_RDI >> 0x20),(float)in_RDI,v1,atlas._0_4_);
    }
  }
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x48); local_2c = local_2c + 1) {
    ppIVar1 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x48),local_2c);
    if (((*ppIVar1)->DirtyLookupTables & 1U) != 0) {
      ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)(in_RDI + 0x48),local_2c);
      ImFont::BuildLookupTable((ImFont *)r);
    }
  }
  *(undefined1 *)(in_RDI + 0x19) = 1;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}